

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void speech_handler(CHAR_DATA *ch,CHAR_DATA *mob,SPEECH_DATA *speech)

{
  string_view fmt;
  size_t sVar1;
  CHAR_DATA *in_RDX;
  CHAR_DATA *in_RSI;
  long in_RDI;
  bool bVar2;
  string buffer;
  int i_1;
  char *point;
  char *copy;
  int i;
  char buf [4608];
  LINE_DATA *line;
  char *in_stack_00002288;
  CHAR_DATA *in_stack_00002290;
  char *in_stack_ffffffffffffebd0;
  char *in_stack_ffffffffffffebd8;
  undefined4 in_stack_ffffffffffffebe0;
  undefined4 in_stack_ffffffffffffebe4;
  CLogger *in_stack_ffffffffffffebf0;
  string *this;
  char *in_stack_ffffffffffffebf8;
  CHAR_DATA *in_stack_ffffffffffffec00;
  size_t *in_stack_ffffffffffffec08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffec10;
  allocator<char> local_13d9;
  string local_13d8 [39];
  allocator<char> local_13b1;
  string local_13b0 [36];
  undefined4 local_138c;
  char (*local_1378) [4608];
  size_t local_1370;
  string local_1368 [48];
  string local_1338 [36];
  int local_1314;
  char *local_1310;
  char *local_1308;
  int local_12fc;
  char_data **in_stack_ffffffffffffed08;
  _func_void_char_data_ptr_char_data_ptr_speech_data_ptr *in_stack_ffffffffffffed10;
  string *in_stack_ffffffffffffed18;
  string *in_stack_ffffffffffffed20;
  int in_stack_ffffffffffffed2c;
  CQueue *in_stack_ffffffffffffed30;
  char_data **in_stack_ffffffffffffed40;
  speech_data **in_stack_ffffffffffffed48;
  format_args in_stack_ffffffffffffee30;
  string_view in_stack_ffffffffffffee40;
  char *in_stack_fffffffffffffe18;
  CHAR_DATA *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  CHAR_DATA *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  CHAR_DATA *in_stack_fffffffffffffe60;
  CHAR_DATA *in_stack_fffffffffffffe68;
  CHAR_DATA *speech_00;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
  local_d8;
  undefined8 local_b8;
  char *in_stack_ffffffffffffff50;
  CHAR_DATA *in_stack_ffffffffffffff58;
  char (*local_88) [4608];
  size_t sStack_80;
  string *local_78;
  char *local_70;
  char (**local_68) [4608];
  char *local_60;
  char (**local_58) [4608];
  char (**local_50) [4608];
  char (*local_48) [4608];
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
  *local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
  *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
  *local_10;
  char *local_8;
  
  if (in_RDX == (CHAR_DATA *)0x0) {
    return;
  }
  if (in_RDX->fighting == (CHAR_DATA *)0x0) {
    return;
  }
  if (in_RSI == (CHAR_DATA *)0x0) {
    return;
  }
  if (in_RSI->in_room == (ROOM_INDEX_DATA *)0x0) {
    return;
  }
  if (in_RSI->position < 5) {
    return;
  }
  speech_00 = in_RDX->reply;
  if (speech_00 == (CHAR_DATA *)0x0) {
    in_RDX->reply = in_RDX->fighting;
    return;
  }
  for (local_12fc = 0; local_12fc < 0x1200; local_12fc = local_12fc + 1) {
    (&stack0xffffffffffffed08)[local_12fc] = 0;
  }
  local_1310 = palloc_string(in_stack_ffffffffffffebf8);
  local_1314 = 0;
  local_1308 = local_1310;
  while( true ) {
    bVar2 = false;
    if (*local_1310 != '\0') {
      bVar2 = *local_1310 != '\0';
    }
    if (!bVar2) break;
    if (*local_1310 == '$') {
      if (local_1310[1] == 'N') {
        local_1310 = local_1310 + 1;
        strcat(&stack0xffffffffffffed08,*(char **)(in_RDI + 0xe8));
        sVar1 = strlen(*(char **)(in_RDI + 0xe8));
        local_1314 = local_1314 + (int)sVar1 + -1;
      }
      else {
        (&stack0xffffffffffffed08)[local_1314] = *local_1310;
      }
    }
    else {
      (&stack0xffffffffffffed08)[local_1314] = *local_1310;
    }
    local_1310 = local_1310 + 1;
    local_1314 = local_1314 + 1;
  }
  free_pstring(in_stack_ffffffffffffebd0);
  std::__cxx11::string::string(local_1338);
  switch(*(undefined2 *)&speech_00->fighting) {
  case 0:
    do_say(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    break;
  case 1:
    say_to(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
           in_stack_fffffffffffffe50);
    break;
  case 2:
    local_68 = &local_1378;
    local_70 = "{} {}";
    local_60 = "{} {}";
    local_1378 = (char (*) [4608])0x7eb971;
    in_stack_ffffffffffffec08 = &local_1370;
    local_58 = local_68;
    in_stack_ffffffffffffec10 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::char_traits<char>::length((char_type *)0x52cd1c);
    in_stack_ffffffffffffec00 = in_RSI;
    *in_stack_ffffffffffffec08 = (size_t)in_stack_ffffffffffffec10;
    local_8 = local_70;
    local_78 = local_1368;
    local_88 = local_1378;
    sStack_80 = local_1370;
    local_50 = &local_88;
    local_48 = local_1378;
    ::fmt::v9::
    make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char*&,char(&)[4608]>
              (&local_d8,(v9 *)(in_RDI + 0xe8),(char **)&stack0xffffffffffffed08,local_1378);
    local_30 = &local_b8;
    local_38 = &local_d8;
    local_20 = 0xcc;
    local_b8 = 0xcc;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffee40,in_stack_ffffffffffffee30);
    this = local_1368;
    std::__cxx11::string::operator=(local_1338,this);
    std::__cxx11::string::~string(this);
    in_RSI = in_stack_ffffffffffffec00;
    std::__cxx11::string::data();
    do_tell(in_stack_00002290,in_stack_00002288);
    break;
  case 3:
    do_whisper(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    break;
  case 4:
    do_yell(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    break;
  case 5:
    do_emote((CHAR_DATA *)buf._3744_8_,(char *)buf._3736_8_);
    break;
  case 6:
    break;
  case 7:
    do_sing((CHAR_DATA *)buf._4072_8_,(char *)buf._4064_8_);
    break;
  default:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffebe4,in_stack_ffffffffffffebe0),
               in_stack_ffffffffffffebd8);
    fmt._M_str = (char *)in_stack_ffffffffffffec00;
    fmt._M_len = (size_t)in_stack_ffffffffffffebf8;
    CLogger::Warn<>(in_stack_ffffffffffffebf0,fmt);
    local_138c = 1;
    goto LAB_0052d129;
  }
  if (speech_00->next_in_room == (CHAR_DATA *)0x0) {
    in_RDX->reply = in_RDX->fighting;
    local_138c = 1;
  }
  else {
    in_RDX->reply = speech_00->next_in_room;
    if (*(int *)((long)&in_RDX->reply->leader + 4) < 1) {
      speech_handler(in_RSI,in_RDX,(SPEECH_DATA *)speech_00);
      local_138c = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffec10,(char *)in_stack_ffffffffffffec08,
                 (allocator<char> *)in_stack_ffffffffffffec00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffec10,(char *)in_stack_ffffffffffffec08,
                 (allocator<char> *)in_stack_ffffffffffffec00);
      CQueue::
      AddToQueue<void(*)(char_data*,char_data*,speech_data*),char_data*&,char_data*&,speech_data*&>
                (in_stack_ffffffffffffed30,in_stack_ffffffffffffed2c,in_stack_ffffffffffffed20,
                 in_stack_ffffffffffffed18,in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,
                 in_stack_ffffffffffffed40,in_stack_ffffffffffffed48);
      std::__cxx11::string::~string(local_13d8);
      std::allocator<char>::~allocator(&local_13d9);
      std::__cxx11::string::~string(local_13b0);
      std::allocator<char>::~allocator(&local_13b1);
      local_138c = 0;
    }
  }
LAB_0052d129:
  std::__cxx11::string::~string(local_1338);
  return;
}

Assistant:

void speech_handler(CHAR_DATA *ch, CHAR_DATA *mob, SPEECH_DATA *speech)
{
	if (!speech || !speech->first_line || !mob || !mob->in_room)
		return;

	if (mob->position < POS_RESTING)
		return;

	auto line = speech->current_line;
	if (line == nullptr)
	{
		speech->current_line = speech->first_line;
		return;
	}

	char buf[MAX_STRING_LENGTH];
	for (auto i = 0; i < MAX_STRING_LENGTH; i++)
	{
		buf[i] = '\0';
	}

	auto copy = palloc_string(line->text);
	auto point = copy;

	for (auto i = 0; *point && *point != '\0'; i++)
	{
		if (*point == '$')
		{
			point++;
			if (*point == 'N')
			{
				strcat(buf, ch->name);
				i += (strlen(ch->name) - 1);
			}
			else
			{
				point--;
				buf[i] = *point;
			}
		}
		else
		{
			buf[i] = *point;
		}
		point++;
	}

	free_pstring(copy);

	std::string buffer; // outside of switch to appease the compiler gods
	switch (line->type)
	{
	case SPEECH_SAY:
		do_say(mob, buf);
		break;
	case SPEECH_SAYTO:
		say_to(mob, ch, buf, "");
		break;
	case SPEECH_TELL:
		buffer = fmt::format("{} {}", ch->name, buf);
		do_tell(mob, buffer.data());
		break;
	case SPEECH_WHISPER:
		do_whisper(mob, buf);
		break;
	case SPEECH_YELL:
		do_yell(mob, buf);
		break;
	case SPEECH_EMOTE:
		do_emote(mob, buf);
		break;
	case SPEECH_ECHO:
		break;
	case SPEECH_SING:
		do_sing(mob, buf);
		break;
	default:
		RS.Logger.Warn("Error in speech -- missing/invalid type.");
		return;
	}

	if (!line->next)
	{
		speech->current_line = speech->first_line;
		return;
	}

	speech->current_line = line->next;

	if (speech->current_line->delay <= 0)
	{
		speech_handler(ch, mob, speech);
		return;
	}

	RS.Queue.AddToQueue(speech->current_line->delay, "speech_handler", "speech_handler", speech_handler, ch, mob, speech);
}